

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O2

int get_random_number(int bits)

{
  ushort uVar1;
  ushort uVar2;
  
  uVar1 = random_register >> 1;
  uVar2 = (random_register ^ uVar1 ^ random_register >> 0xc ^ random_register >> 3) << 0xf;
  random_register = uVar2 | uVar1;
  return ~(-1 << ((byte)bits & 0x1f)) &
         (uint)(ushort)((uVar2 | uVar1) >> (0x10 - (byte)bits & 0x1f));
}

Assistant:

static inline int get_random_number(int bits) {
  uint16_t bit;
  bit = ((random_register >> 0) ^ (random_register >> 1) ^
         (random_register >> 3) ^ (random_register >> 12)) &
        1;
  random_register = (random_register >> 1) | (bit << 15);
  return (random_register >> (16 - bits)) & ((1 << bits) - 1);
}